

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

Action<test_result_(fmt::v5::basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>::handle)>
* __thiscall
testing::internal::
OnCallSpec<test_result_(fmt::v5::basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>::handle)>
::GetAction(OnCallSpec<test_result_(fmt::v5::basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>::handle)>
            *this)

{
  Clause CVar1;
  uint uVar2;
  char *pcVar3;
  FailureReporterInterface *pFVar4;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  CVar1 = (this->super_UntypedOnCallSpecBase).last_clause_;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,".WillByDefault() must appear exactly once in an ON_CALL().","");
  if (CVar1 != kWillByDefault) {
    uVar2 = (this->super_UntypedOnCallSpecBase).line_;
    pcVar3 = (this->super_UntypedOnCallSpecBase).file_;
    pFVar4 = GetFailureReporter();
    (*pFVar4->_vptr_FailureReporterInterface[2])(pFVar4,1,pcVar3,(ulong)uVar2,local_40);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return &this->action_;
}

Assistant:

const Action<F>& GetAction() const {
    AssertSpecProperty(last_clause_ == kWillByDefault,
                       ".WillByDefault() must appear exactly "
                       "once in an ON_CALL().");
    return action_;
  }